

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void pop_up_invoke_options_proc(Am_Object *cmd)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  int value;
  Am_Wrapper *value_00;
  Am_Value *pAVar3;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object match_command;
  int before_after;
  Am_Object local_80;
  char local_78 [8];
  char accel_string [38];
  Am_Input_Char local_44;
  Am_Input_Char accel_char;
  Am_Object script_execute_command;
  Am_Object invoke_window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object script_window;
  Am_Object *cmd_local;
  
  script_window.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  get_invoke_window();
  AVar1 = Am_SCRIPT_WINDOW;
  value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&local_18);
  Am_Object::Set(&script_execute_command,AVar1,value_00,0);
  pAVar3 = Am_Object::Get(&local_18,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc0,pAVar3);
  AVar1 = Am_INVOKE_MATCH_COMMAND;
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc0,Am_BEFORE_OR_AFTER_COMMAND,0);
  Am_Object::Set(&script_execute_command,AVar1,pAVar3,0);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc0,0x152,0);
  Am_Input_Char::Am_Input_Char(&local_44,pAVar3);
  bVar2 = Am_Input_Char::Valid(&local_44);
  if (bVar2) {
    Am_Input_Char::As_Short_String(&local_44,local_78);
  }
  else {
    local_78[0] = '\0';
  }
  Am_Object::Get_Object(&local_80,(Am_Slot_Key)&script_execute_command,(ulong)Am_DO_ACCELERATOR);
  bVar2 = Am_Input_Char::Valid(&local_44);
  Am_Object::Set(&local_80,0x169,bVar2,0);
  Am_Object::~Am_Object(&local_80);
  Am_Object::Get_Object
            ((Am_Object *)&stack0xffffffffffffff78,(Am_Slot_Key)&script_execute_command,0x152);
  Am_Object::Set((Am_Object *)&stack0xffffffffffffff78,0x169,local_78,0);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff78);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc0,Am_BEFORE_OR_AFTER,0);
  value = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Get_Object
            (&match_command,(Am_Slot_Key)&script_execute_command,(ulong)Am_BEFORE_OR_AFTER);
  Am_Object::Set(&match_command,0x169,value,0);
  Am_Object::~Am_Object(&match_command);
  if (value == 0) {
    Am_Object::Get_Object
              (&local_a8,(Am_Slot_Key)&script_execute_command,(ulong)Am_UNDO_SCROLL_GROUP);
    Am_Object::Set(&local_a8,0xa2,0,0);
    Am_Object::~Am_Object(&local_a8);
  }
  else {
    pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc0,Am_BEFORE_OR_AFTER_COMMAND,0);
    Am_Object::Am_Object(&local_a0,pAVar3);
    am_set_commands_into_script_window(&script_execute_command,&local_a0);
    Am_Object::~Am_Object(&local_a0);
  }
  Am_Object::Set(&script_execute_command,0x69,true,0);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  Am_Object::~Am_Object(&script_execute_command);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, pop_up_invoke_options, (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object invoke_window = get_invoke_window();
  invoke_window.Set(Am_SCRIPT_WINDOW, script_window);

  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  invoke_window.Set(Am_INVOKE_MATCH_COMMAND,
                    script_execute_command.Get(Am_BEFORE_OR_AFTER_COMMAND));

  //deal with accel chars
  Am_Input_Char accel_char = script_execute_command.Get(Am_ACCELERATOR);
  char accel_string[Am_LONGEST_CHAR_STRING];
  if (accel_char.Valid())
    accel_char.As_Short_String(accel_string);
  else
    accel_string[0] = 0; //zero length string;
  invoke_window.Get_Object(Am_DO_ACCELERATOR).Set(Am_VALUE, accel_char.Valid());
  invoke_window.Get_Object(Am_ACCELERATOR).Set(Am_VALUE, accel_string);

  // deal with before/after commands
  int before_after = script_execute_command.Get(Am_BEFORE_OR_AFTER);
  invoke_window.Get_Object(Am_BEFORE_OR_AFTER).Set(Am_VALUE, before_after);
  if (before_after != 0) {
    Am_Object match_command =
        script_execute_command.Get(Am_BEFORE_OR_AFTER_COMMAND);
    am_set_commands_into_script_window(invoke_window, match_command);
  } else
    invoke_window.Get_Object(Am_UNDO_SCROLL_GROUP).Set(Am_ITEMS, (0L));
  invoke_window.Set(Am_VISIBLE, true);
}